

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObject_private.hh
# Opt level: O2

void __thiscall
QPDFObject::ChildDescr::ChildDescr
          (ChildDescr *this,shared_ptr<QPDFObject> *parent,string_view *static_descr,
          string *var_descr)

{
  std::__weak_ptr<QPDFObject,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<QPDFObject,void>
            ((__weak_ptr<QPDFObject,(__gnu_cxx::_Lock_policy)2> *)this,
             &parent->super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>);
  this->static_descr = static_descr;
  std::__cxx11::string::string((string *)&this->var_descr,(string *)var_descr);
  return;
}

Assistant:

ChildDescr(
            std::shared_ptr<QPDFObject> parent,
            std::string_view const& static_descr,
            std::string var_descr) :
            parent(parent),
            static_descr(static_descr),
            var_descr(var_descr)
        {
        }